

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

string * __thiscall NTrodeObj::getPrintStr_abi_cxx11_(NTrodeObj *this,int indent)

{
  ostream *poVar1;
  size_type sVar2;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  int k_3;
  int i;
  int k_2;
  int k_1;
  int k;
  string indentStr;
  ostringstream oss;
  ostream *in_stack_fffffffffffffdb8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  allocator local_1b1;
  string local_1b0 [32];
  ostringstream local_190 [380];
  int local_14;
  
  local_14 = in_EDX;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"    ",&local_1b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  for (local_1c8 = 0; local_1c8 < local_14; local_1c8 = local_1c8 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  std::operator<<((ostream *)local_190,"Printing \'NTrodeObj\'\n");
  for (local_1cc = 0; local_1cc < local_14; local_1cc = local_1cc + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar1 = std::operator<<((ostream *)local_190,"    -id : ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  std::operator<<(poVar1,"\n");
  for (local_1d0 = 0; local_1d0 < local_14; local_1d0 = local_1d0 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar1 = std::operator<<((ostream *)local_190,"    -hw_chans vector size[");
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x30));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(poVar1,"]:\n");
  local_1d4 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x30));
    if ((int)sVar2 <= local_1d4) break;
    for (local_1d8 = 0; local_1d8 < local_14; local_1d8 = local_1d8 + 1) {
      std::operator<<((ostream *)local_190,local_1b0);
    }
    poVar1 = std::operator<<((ostream *)local_190,"        - i[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d4);
    poVar1 = std::operator<<(poVar1,"] : ");
    in_stack_fffffffffffffdc0 =
         (vector<int,_std::allocator<int>_> *)
         std::vector<int,_std::allocator<int>_>::at
                   (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffdb8 =
         (ostream *)
         std::ostream::operator<<
                   (poVar1,*(int *)&(in_stack_fffffffffffffdc0->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start);
    std::operator<<(in_stack_fffffffffffffdb8,"\n");
    local_1d4 = local_1d4 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string NTrodeObj::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "    ";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "Printing 'NTrodeObj'\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -id : " << id << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -hw_chans vector size[" << hw_chans.size() << "]:\n";
    for (int i = 0; i < (int)hw_chans.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : " << hw_chans.at(i) << "\n";
    }
    return(oss.str());
}